

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_lsa(DisasContext_conflict6 *ctx,int opc,int rd,int rs,int rt,int imm2)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int imm2_local;
  int rt_local;
  int rs_local;
  int rd_local;
  int opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (rd != 0) {
    t = tcg_temp_new_i64(tcg_ctx_00);
    t_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,t,rs);
    gen_load_gpr(tcg_ctx_00,t_00,rt);
    tcg_gen_shli_i64_mips64el(tcg_ctx_00,t,t,(long)(imm2 + 1));
    tcg_gen_add_i64(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t,t_00);
    if (opc == 5) {
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rd]);
    }
    tcg_temp_free_i64(tcg_ctx_00,t_00);
    tcg_temp_free_i64(tcg_ctx_00,t);
  }
  return;
}

Assistant:

static void gen_lsa(DisasContext *ctx, int opc, int rd, int rs, int rt,
                    int imm2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv t1;
    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);
    tcg_gen_shli_tl(tcg_ctx, t0, t0, imm2 + 1);
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
    if (opc == OPC_LSA) {
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
    }

    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t0);

    return;
}